

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalOpenMutex
                    (CPalThread *pthr,DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName,
                    HANDLE *phMutex)

{
  PAL_ERROR PVar1;
  size_t sVar2;
  LPCWSTR local_50;
  CPalString sObjectName;
  long *local_38;
  IPalObject *pobjMutex;
  
  local_38 = (long *)0x0;
  sObjectName.m_dwStringLength = dwDesiredAccess;
  sObjectName.m_dwMaxLength = bInheritHandle;
  sVar2 = PAL_wcslen(lpName);
  sObjectName.m_pwsz._0_4_ = (int)sVar2;
  sObjectName.m_pwsz._4_4_ = (int)sObjectName.m_pwsz + 1;
  local_50 = lpName;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x216);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (lpName == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x217);
    fprintf(_stderr,"Expression: NULL != lpName\n");
  }
  if (phMutex == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x218);
    fprintf(_stderr,"Expression: NULL != phMutex\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    PVar1 = (**(code **)(*g_pObjectManager + 0x10))
                      (g_pObjectManager,pthr,&local_50,&aotMutex,&local_38);
    if (PVar1 == 0) {
      PVar1 = (**(code **)(*g_pObjectManager + 0x18))
                        (g_pObjectManager,pthr,local_38,sObjectName.m_dwStringLength,
                         sObjectName.m_dwMaxLength != 0,0,phMutex);
    }
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 0x40))(local_38,pthr);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalOpenMutex(
    CPalThread *pthr,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    LPCWSTR lpName,
    HANDLE *phMutex
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjMutex = NULL;
    CPalString sObjectName(lpName);

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != lpName);
    _ASSERTE(NULL != phMutex);

    ENTRY("InternalOpenMutex(pthr=%p, dwDesiredAccess=%d, bInheritHandle=%d, "
        "lpName=%p, phMutex=%p)\n",
        pthr,
        dwDesiredAccess,
        bInheritHandle,
        lpName,
        phMutex
        );

    palError = g_pObjectManager->LocateObject(
        pthr,
        &sObjectName,
        &aotMutex,
        &pobjMutex
        );

    if (NO_ERROR != palError)
    {
        goto InternalOpenMutexExit;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pthr,
        pobjMutex,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phMutex
        );

    if (NO_ERROR != palError)
    {
        goto InternalOpenMutexExit;
    }

InternalOpenMutexExit:

    if (NULL != pobjMutex)
    {
        pobjMutex->ReleaseReference(pthr);
    }

    LOGEXIT("InternalOpenMutex returns %d\n", palError);

    return palError;
}